

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O0

void __thiscall GlobOpt::ProcessArrayValueKills(GlobOpt *this,Instr *instr)

{
  OpCode OVar1;
  JnHelperMethod JVar2;
  code *pcVar3;
  bool bVar4;
  Opnd *pOVar5;
  undefined4 *puVar6;
  HelperCallOpnd *pHVar7;
  Instr *instr_local;
  GlobOpt *this_local;
  
  OVar1 = instr->m_opcode;
  if (((((((OVar1 != StFld) && (OVar1 != StRootFld)) && (OVar1 != StFldStrict)) &&
        ((OVar1 != StRootFldStrict && (3 < (ushort)(OVar1 - DeleteFld))))) &&
       ((3 < (ushort)(OVar1 - ScopedStFld) && ((OVar1 != StElemI_A && (OVar1 != StElemI_A_Strict))))
       )) && (1 < (ushort)(OVar1 - DeleteElemI_A))) &&
     (((OVar1 != StSuperFld && (OVar1 != StSuperFldStrict)) &&
      (1 < (ushort)(OVar1 - ConsoleScopedStFld))))) {
    if (OVar1 == CallDirect) {
      pOVar5 = IR::Instr::GetSrc1(instr);
      if (pOVar5 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x350,"(instr->GetSrc1())","instr->GetSrc1()");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pOVar5 = IR::Instr::GetSrc1(instr);
      pHVar7 = IR::Opnd::AsHelperCallOpnd(pOVar5);
      JVar2 = pHVar7->m_fnHelper;
      if (((JVar2 != HelperArray_Concat) && (1 < JVar2 - HelperArray_Reverse)) &&
         (JVar2 != HelperArray_Splice && JVar2 != HelperArray_Unshift)) {
        return;
      }
      BVSparse<Memory::JitArenaAllocator>::ClearAll
                ((this->currentBlock->globOptData).liveArrayValues);
      return;
    }
    if (((1 < (ushort)(OVar1 - StSlot)) && (OVar1 != StArrViewElem)) &&
       ((OVar1 != StElemC && (OVar1 != InlineArrayPop && OVar1 != InlineArrayPush)))) {
      bVar4 = IR::Instr::UsesAllFields(instr);
      if (!bVar4) {
        return;
      }
      BVSparse<Memory::JitArenaAllocator>::ClearAll
                ((this->currentBlock->globOptData).liveArrayValues);
      return;
    }
  }
  BVSparse<Memory::JitArenaAllocator>::ClearAll((this->currentBlock->globOptData).liveArrayValues);
  return;
}

Assistant:

void
GlobOpt::ProcessArrayValueKills(IR::Instr *instr)
{
    switch (instr->m_opcode)
    {
    case Js::OpCode::StElemC:
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    case Js::OpCode::DeleteElemI_A:
    case Js::OpCode::DeleteElemIStrict_A:
    case Js::OpCode::ConsoleScopedStFld:
    case Js::OpCode::ConsoleScopedStFldStrict:
    case Js::OpCode::ScopedStFld:
    case Js::OpCode::ScopedStFldStrict:
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    case Js::OpCode::StSuperFld:
    case Js::OpCode::StSuperFldStrict:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
    case Js::OpCode::DeleteFld:
    case Js::OpCode::DeleteRootFld:
    case Js::OpCode::DeleteFldStrict:
    case Js::OpCode::DeleteRootFldStrict:
    case Js::OpCode::ScopedDeleteFld:
    case Js::OpCode::ScopedDeleteFldStrict:
    case Js::OpCode::StArrViewElem:
    // These array helpers may change A.length (and A[i] could be A.length)...
    case Js::OpCode::InlineArrayPush:
    case Js::OpCode::InlineArrayPop:
        this->currentBlock->globOptData.liveArrayValues->ClearAll();
        break;

    case Js::OpCode::CallDirect:
        Assert(instr->GetSrc1());
        switch(instr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper)
        {
            // These array helpers may change A[i]
            case IR::HelperArray_Reverse:
            case IR::HelperArray_Shift:
            case IR::HelperArray_Unshift:
            case IR::HelperArray_Splice:
            case IR::HelperArray_Concat:
                this->currentBlock->globOptData.liveArrayValues->ClearAll();
                break;
        }
        break;
    default:
        if (instr->UsesAllFields())
        {
            this->currentBlock->globOptData.liveArrayValues->ClearAll();
        }
        break;
    }
}